

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O2

string * format(string *__return_storage_ptr__,string *fmt,string *arg1,int arg2)

{
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)fmt);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"{1}",(allocator<char> *)&local_38);
  replace_positional(__return_storage_ptr__,&local_58,arg1);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"{2}",&local_59);
  format_abi_cxx11_(&local_38,arg2);
  replace_positional(__return_storage_ptr__,&local_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

const std::string format (
  const std::string& fmt,
  const std::string& arg1,
  int arg2)
{
  std::string output = fmt;
  replace_positional (output, "{1}", arg1);
  replace_positional (output, "{2}", format (arg2));
  return output;
}